

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O3

int history_def_set(void *p,HistEvent_conflict *ev,int n)

{
  char *pcVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  
  if (*(int *)((long)p + 0x34) == 0) {
    pcVar1 = "empty list";
    iVar2 = 5;
  }
  else {
    piVar4 = *(int **)((long)p + 0x28);
    piVar3 = (int *)p;
    if ((piVar4 == (int *)p) || (*piVar4 != n)) {
      do {
        piVar4 = *(int **)(piVar3 + 6);
        if (piVar4 == (int *)p) break;
        piVar3 = piVar4;
      } while (*piVar4 != n);
      *(int **)((long)p + 0x28) = piVar4;
    }
    if (piVar4 != (int *)p) {
      return 0;
    }
    pcVar1 = "event not found";
    iVar2 = 9;
  }
  ev->num = iVar2;
  ev->str = pcVar1;
  return -1;
}

Assistant:

static int
history_def_set(void *p, TYPE(HistEvent) *ev, const int n)
{
	history_t *h = (history_t *) p;

	if (h->cur == 0) {
		he_seterrev(ev, _HE_EMPTY_LIST);
		return -1;
	}
	if (h->cursor == &h->list || h->cursor->ev.num != n) {
		for (h->cursor = h->list.next; h->cursor != &h->list;
		    h->cursor = h->cursor->next)
			if (h->cursor->ev.num == n)
				break;
	}
	if (h->cursor == &h->list) {
		he_seterrev(ev, _HE_NOT_FOUND);
		return -1;
	}
	return 0;
}